

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O3

bool __thiscall Analyzer::nameLooksLikeFunctionMustReturnResult(Analyzer *this,char *name)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  
  if ((name != (char *)0x0) && (cVar1 = *name, cVar1 != '\0')) {
    bVar2 = settings::has_prefix
                      (name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)settings::function_should_return_bool_prefix_abi_cxx11_);
    if (bVar2) {
      return true;
    }
    bVar2 = settings::has_prefix
                      (name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)settings::function_should_return_something_prefix_abi_cxx11_);
    if (bVar2) {
      return true;
    }
    pcVar3 = strstr(name,"_ctor");
    if ((pcVar3 != (char *)0x0) || (pcVar3 = strstr(name,"Ctor"), pcVar3 != (char *)0x0)) {
      if (cVar1 != 's') {
        return true;
      }
      if (name[1] != 'e') {
        return true;
      }
      return name[2] != 't';
    }
  }
  return false;
}

Assistant:

bool nameLooksLikeFunctionMustReturnResult(const char * name)
  {
    if (!name || !name[0])
      return false;

    bool nameInList = nameLooksLikeResultMustBeBoolean(name) ||
      settings::has_prefix(name, settings::function_should_return_something_prefix);

    if (!nameInList)
      if ((strstr(name, "_ctor") || strstr(name, "Ctor")) && strstr(name, "set") != name)
        nameInList = true;

    return nameInList;
  }